

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void __thiscall amrex::VisMF::VisMF(VisMF *this,string *fafab_name)

{
  Header *this_00;
  Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  *this_01;
  pointer pcVar1;
  pointer pVVar2;
  element_type *peVar3;
  uint uVar4;
  pointer pVVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  string FullHdrFileName;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string fileCharPtrString;
  istringstream infs;
  string local_218;
  Vector<char,_std::allocator<char>_> local_1f8;
  Header *local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  MPI_Comm local_1b0 [30];
  ios_base local_138 [264];
  
  (this->m_fafabname)._M_dataplus._M_p = (pointer)&(this->m_fafabname).field_2;
  pcVar1 = (fafab_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + fafab_name->_M_string_length);
  this_00 = &this->m_hdr;
  Header::Header(this_00);
  this_01 = &this->m_pa;
  (this->m_pa).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pa).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pa).
  super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  .
  super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  pcVar1 = (this->m_fafabname)._M_dataplus._M_p;
  local_1d8 = this_00;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar1,pcVar1 + (this->m_fafabname)._M_string_length);
  std::__cxx11::string::append((char *)&local_218);
  local_1f8.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (char *)0x0;
  local_1f8.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_1f8.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_1b0[0] = ParallelDescriptor::m_comm;
  ParallelDescriptor::ReadAndBcastFile(&local_218,&local_1f8,true,local_1b0);
  std::__cxx11::string::string
            ((string *)local_1d0,
             local_1f8.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)local_1b0);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_1d0,_S_in);
  amrex::operator>>((istream *)local_1b0,this_00);
  std::
  vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::resize(&this_01->
            super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           ,(long)(this->m_hdr).m_ncomp);
  pVVar5 = (this->m_pa).
           super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_pa).
           super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar2 != pVVar5 && -1 < (long)pVVar2 - (long)pVVar5) {
    lVar8 = 0;
    do {
      peVar3 = (this->m_hdr).m_ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::resize
                (&pVVar5[lVar8].
                  super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,
                 ((long)*(pointer *)
                         ((long)&(peVar3->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data + 8) -
                  *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7);
      pVVar5 = (this_01->
               super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               ).
               super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&pVVar5[lVar8].
                                            super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                            .
                                            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                    + 8) -
                            *(long *)&pVVar5[lVar8].
                                      super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                      .
                                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                            ) >> 3);
      if (0 < (int)uVar4) {
        uVar6 = 0;
        do {
          *(undefined8 *)
           (*(long *)&(this_01->
                      super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar8].
                      super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> +
           uVar6 * 8) = 0;
          uVar6 = uVar6 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar6);
      }
      lVar8 = lVar8 + 1;
      pVVar5 = (this->m_pa).
               super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = ((long)(this->m_pa).
                     super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 3) *
              -0x5555555555555555;
    } while (lVar7 - lVar8 != 0 && lVar8 <= lVar7);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  if (local_1f8.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (char *)0x0) {
    operator_delete(local_1f8.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_1f8.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_1f8.super_vector<char,_std::allocator<char>_>.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

VisMF::VisMF (const std::string &fafab_name)
    :
    m_fafabname(fafab_name)
{
    std::string FullHdrFileName(m_fafabname);

    FullHdrFileName += TheMultiFabHdrFileSuffix;

    Vector<char> fileCharPtr;
    ParallelDescriptor::ReadAndBcastFile(FullHdrFileName, fileCharPtr);
    std::string fileCharPtrString(fileCharPtr.dataPtr());
    std::istringstream infs(fileCharPtrString, std::istringstream::in);

    infs >> m_hdr;

    m_pa.resize(m_hdr.m_ncomp);

    for(int n(0); n < m_pa.size(); ++n) {
        m_pa[n].resize(m_hdr.m_ba.size());

        for(int ii(0), N(m_pa[n].size()); ii < N; ++ii) {
            m_pa[n][ii] = 0;
        }
    }
}